

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O2

ByteCode * __thiscall
ag::Generator::FunctionManager::Get(ByteCode *__return_storage_ptr__,FunctionManager *this,size_t i)

{
  pointer pBVar1;
  size_t sVar2;
  pointer pvVar3;
  long lVar4;
  size_t j;
  ulong uVar5;
  ByteCode *this_00;
  long lVar6;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  pBVar1 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = (this->m_lengthAddr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[i];
  BitConverter::GetUInt32
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
             (*(int *)((long)&pBVar1[i].m_bytes.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8) + -4) -
             (*(int *)&pBVar1[i].m_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
             (int)sVar2));
  ByteCode::Write(pBVar1 + i,sVar2,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  lVar6 = 8;
  uVar5 = 0;
  while( true ) {
    pvVar3 = (this->m_linkAddr).
             super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = *(long *)&pvVar3[i].
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data;
    this_00 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl
              .super__Vector_impl_data._M_start + i;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar3[i].
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 4) <= uVar5) break;
    sVar2 = *(size_t *)(lVar4 + -8 + lVar6);
    BitConverter::GetUInt32
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
               (*(int *)(lVar4 + lVar6) + -4) -
               (int)(this->m_lengthAddr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[i]);
    ByteCode::Write(this_00,sVar2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48
                   );
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x10;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&__return_storage_ptr__->m_bytes,&this_00->m_bytes);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get(size_t i)
			{
				m_code[i].Write(m_lengthAddr[i],
					BitConverter::GetUInt32(
						m_code[i].Count() - (m_lengthAddr[i] + sizeof(uint32_t))
					)
				);

				for (size_t j = 0; j < m_linkAddr[i].size(); j++)
					m_code[i].Write(m_linkAddr[i][j].first,
						BitConverter::GetUInt32(
							m_linkAddr[i][j].second - (m_lengthAddr[i] + sizeof(uint32_t))
						)
					);

				return m_code[i];
			}